

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_entropy.c
# Opt level: O0

MPP_RET vp8e_calc_coeff_prob
                  (Vp8ePutBitBuf *bitbuf,RK_S32 (*curr) [4] [8] [3] [11],
                  RK_S32 (*prev) [4] [8] [3] [11])

{
  RK_S32 prob_00;
  int value;
  RK_S32 old;
  RK_S32 new;
  RK_S32 prob;
  RK_S32 l;
  RK_S32 k;
  RK_S32 j;
  RK_S32 i;
  RK_S32 (*prev_local) [4] [8] [3] [11];
  RK_S32 (*curr_local) [4] [8] [3] [11];
  Vp8ePutBitBuf *bitbuf_local;
  
  for (k = 0; k < 4; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (prob = 0; prob < 3; prob = prob + 1) {
        for (new = 0; new < 0xb; new = new + 1) {
          prob_00 = coeff_update_prob_tbl[k][l][prob][new];
          value = (*curr)[k][l][prob][new];
          if (value == (*prev)[k][l][prob][new]) {
            vp8e_put_bool(bitbuf,prob_00,0);
          }
          else {
            vp8e_put_bool(bitbuf,prob_00,1);
            vp8e_put_lit(bitbuf,value,8);
          }
        }
      }
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET vp8e_calc_coeff_prob(Vp8ePutBitBuf *bitbuf, RK_S32 (*curr)[4][8][3][11],
                             RK_S32 (*prev)[4][8][3][11])
{
    RK_S32 i, j, k, l;
    RK_S32 prob, new, old;

    for (i = 0; i < 4; i++) {
        for (j = 0; j < 8; j++) {
            for (k = 0; k < 3; k++) {
                for (l = 0; l < 11; l++) {
                    prob = coeff_update_prob_tbl[i][j][k][l];
                    old = (RK_S32) (*prev)[i][j][k][l];
                    new = (RK_S32) (*curr)[i][j][k][l];

                    if (new == old) {
                        vp8e_put_bool(bitbuf, prob, 0);
                    } else {
                        vp8e_put_bool(bitbuf, prob, 1);
                        vp8e_put_lit(bitbuf, new, 8);
                    }
                }
            }
        }
    }
    return MPP_OK;
}